

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmregex.cpp
# Opt level: O2

void __thiscall CRegexParser::build_char(CRegexParser *this,re_machine *machine,wchar_t ch)

{
  init_machine(this,machine);
  set_trans(this,machine->init,machine->final,RE_LITERAL,ch);
  return;
}

Assistant:

void CRegexParser::build_char(re_machine *machine, wchar_t ch)
{
    /* initialize our new machine */
    init_machine(machine);

    /* allocate a transition tuple for the new state */
    set_trans(machine->init, machine->final, RE_LITERAL, ch);
}